

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O3

int Mvc_CoverFirstCubeFirstLit(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t *pMVar1;
  uint uVar2;
  
  pMVar1 = Mvc_CoverReadCubeHead(pCover);
  if (0 < pCover->nBits) {
    uVar2 = 0;
    do {
      if ((pMVar1->pData[uVar2 >> 5] >> (uVar2 & 0x1f) & 1) != 0) {
        return uVar2;
      }
      uVar2 = uVar2 + 1;
    } while (pCover->nBits != uVar2);
  }
  return -1;
}

Assistant:

int Mvc_CoverFirstCubeFirstLit( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int iBit, Value;

    // get the first cube
    pCube = Mvc_CoverReadCubeHead( pCover );
    // get the first literal
    Mvc_CubeForEachBit( pCover, pCube, iBit, Value )
        if ( Value )
            return iBit;
    return -1;
}